

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

_Bool rsa_ssh1_decrypt_pkcs1(mp_int *input,RSAKey *key,strbuf *outbuf)

{
  uint8_t val;
  uchar uVar1;
  strbuf *buf_o;
  mp_int *x;
  size_t sVar2;
  ptrlen data_00;
  uchar byte;
  ulong local_68;
  size_t i;
  mp_int *b;
  BinarySource src [1];
  _Bool success;
  strbuf *data;
  strbuf *outbuf_local;
  RSAKey *key_local;
  mp_int *input_local;
  
  buf_o = strbuf_new_nm();
  src[0].binarysource_._7_1_ = 0;
  x = rsa_ssh1_decrypt(input,key);
  sVar2 = mp_get_nbits(key->modulus);
  local_68 = sVar2 + 7 >> 3;
  while (local_68 != 0) {
    val = mp_get_byte(x,local_68 - 1);
    BinarySink_put_byte(buf_o->binarysink_,val);
    local_68 = local_68 - 1;
  }
  mp_free(x);
  data_00 = make_ptrlen(buf_o->u,buf_o->len);
  BinarySource_INIT__((BinarySource *)&b,data_00);
  uVar1 = BinarySource_get_byte((BinarySource *)src[0]._24_8_);
  if ((uVar1 == '\0') &&
     (uVar1 = BinarySource_get_byte((BinarySource *)src[0]._24_8_), uVar1 == '\x02')) {
    do {
      uVar1 = BinarySource_get_byte((BinarySource *)src[0]._24_8_);
      if (*(int *)(src[0]._24_8_ + 0x18) != 0) goto LAB_00190cac;
    } while (uVar1 != '\0');
    src[0].binarysource_._7_1_ = 1;
    BinarySink_put_data(outbuf->binarysink_,
                        (void *)(*(long *)src[0]._24_8_ + *(long *)(src[0]._24_8_ + 8)),
                        *(long *)(src[0]._24_8_ + 0x10) - *(long *)(src[0]._24_8_ + 8));
  }
LAB_00190cac:
  strbuf_free(buf_o);
  return (_Bool)(src[0].binarysource_._7_1_ & 1);
}

Assistant:

bool rsa_ssh1_decrypt_pkcs1(mp_int *input, RSAKey *key,
                            strbuf *outbuf)
{
    strbuf *data = strbuf_new_nm();
    bool success = false;
    BinarySource src[1];

    {
        mp_int *b = rsa_ssh1_decrypt(input, key);
        for (size_t i = (mp_get_nbits(key->modulus) + 7) / 8; i-- > 0 ;) {
            put_byte(data, mp_get_byte(b, i));
        }
        mp_free(b);
    }

    BinarySource_BARE_INIT(src, data->u, data->len);

    /* Check PKCS#1 formatting prefix */
    if (get_byte(src) != 0) goto out;
    if (get_byte(src) != 2) goto out;
    while (1) {
        unsigned char byte = get_byte(src);
        if (get_err(src)) goto out;
        if (byte == 0)
            break;
    }

    /* Everything else is the payload */
    success = true;
    put_data(outbuf, get_ptr(src), get_avail(src));

  out:
    strbuf_free(data);
    return success;
}